

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_common_content_access<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>,std::pair<unsigned_int,unsigned_int>>
               (Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>
                *col,set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *setcont,vector<unsigned_int,_std::allocator<unsigned_int>_> *veccont)

{
  uint uVar1;
  pointer ppEVar2;
  __buckets_ptr pp_Var3;
  _Hash_node_base *p_Var4;
  long lVar5;
  bool bVar6;
  int iVar7;
  pointer puVar8;
  __node_base_ptr p_Var9;
  __hash_code __code;
  ulong uVar10;
  ulong uVar11;
  pointer ppEVar12;
  __node_base_ptr p_Var13;
  __node_base_ptr p_Var14;
  uint uVar15;
  Entry entry;
  vector<unsigned_int,_std::allocator<unsigned_int>_> container;
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_238;
  _Rb_tree_node_base local_208;
  undefined **local_1e8;
  ulong local_1e0;
  shared_count sStack_1d8;
  _Base_ptr **local_1d0;
  _Rb_tree_node_base local_1c8;
  _Base_ptr local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  _Base_ptr local_140;
  _Base_ptr local_138;
  _Base_ptr *local_130;
  _Base_ptr *local_128;
  char *local_120;
  _Base_ptr local_118;
  _Base_ptr local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_50,0x11d);
  get_column_content_via_iterators<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>>
            ((column_content<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_>
              *)&local_238,col);
  if (local_238._M_impl.super__Rb_tree_header._M_node_count ==
      (setcont->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
    bVar6 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::pair<unsigned_int,unsigned_int>>,std::_Rb_tree_const_iterator<std::pair<unsigned_int,unsigned_int>>>
                      ((_Rb_tree_const_iterator<std::pair<unsigned_int,_unsigned_int>_>)
                       local_238._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::pair<unsigned_int,_unsigned_int>_>)
                       &local_238._M_impl.super__Rb_tree_header,
                       (setcont->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar6 = false;
  }
  local_208._M_color._0_1_ = bVar6;
  local_208._M_parent = (_Base_ptr)0x0;
  local_208._M_left = (_Base_ptr)0x0;
  local_1d0 = (_Base_ptr **)&local_1c8;
  local_1c8._0_8_ = "get_column_content_via_iterators(col) == setcont";
  local_1c8._M_parent = (_Base_ptr)0x1ebe9f;
  local_1e0 = local_1e0 & 0xffffffffffffff00;
  local_1e8 = &PTR__lazy_ostream_0022f378;
  sStack_1d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&local_208._M_left);
  std::
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree(&local_238);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x11e);
  uVar15 = (uint)((ulong)((long)(veccont->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(veccont->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
  local_1c8._M_right = (_Base_ptr)setcont;
  if ((int)uVar15 < 0) {
    ppEVar12 = (col->column_).
               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    if (ppEVar12 ==
        (col->column_).
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_208._0_8_ = (_Base_ptr)0x0;
      local_208._M_parent = (_Base_ptr)0x0;
      local_208._M_left = (_Base_ptr)0x0;
      goto LAB_00134c3f;
    }
    uVar15 = ppEVar12[-1]->rowIndex_ + 1;
  }
  local_238._M_impl._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_208,(long)(int)uVar15,
             (value_type_conflict1 *)&local_238,(allocator_type *)&local_1c8);
  ppEVar12 = (col->column_).
             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppEVar2 = (col->column_).
            super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppEVar12 != ppEVar2) {
    pp_Var3 = (col->erasedValues_)._M_h._M_buckets;
    uVar11 = (col->erasedValues_)._M_h._M_bucket_count;
    local_1a8 = (_Base_ptr)local_208._0_8_;
    do {
      uVar1 = (*ppEVar12)->rowIndex_;
      if (uVar15 <= uVar1) break;
      uVar10 = (ulong)uVar1 % uVar11;
      p_Var14 = pp_Var3[uVar10];
      p_Var9 = (__node_base_ptr)0x0;
      if ((p_Var14 != (__node_base_ptr)0x0) &&
         (p_Var9 = p_Var14, p_Var13 = p_Var14->_M_nxt, uVar1 != *(uint *)&p_Var14->_M_nxt[1]._M_nxt)
         ) {
        while (p_Var4 = p_Var13->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
          p_Var9 = (__node_base_ptr)0x0;
          if (((ulong)*(uint *)&p_Var4[1]._M_nxt % uVar11 != uVar10) ||
             (p_Var9 = p_Var13, p_Var13 = p_Var4, uVar1 == *(uint *)&p_Var4[1]._M_nxt))
          goto LAB_00134c05;
        }
        p_Var9 = (__node_base_ptr)0x0;
      }
LAB_00134c05:
      if ((p_Var9 == (__node_base_ptr)0x0) || (p_Var9->_M_nxt == (_Hash_node_base *)0x0)) {
        ((_Rb_tree_color *)local_208._0_8_)[uVar1] =
             ((*ppEVar12)->super_Entry_field_element_option).element_;
      }
      ppEVar12 = ppEVar12 + 1;
    } while (ppEVar12 != ppEVar2);
  }
LAB_00134c3f:
  puVar8 = (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_208._M_parent - local_208._0_8_ ==
      (long)(veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar8) {
    if (local_208._M_parent == (_Base_ptr)local_208._0_8_) {
      bVar6 = true;
    }
    else {
      iVar7 = bcmp((void *)local_208._0_8_,puVar8,(long)local_208._M_parent - local_208._0_8_);
      bVar6 = iVar7 == 0;
    }
  }
  else {
    bVar6 = false;
  }
  local_1e8 = (undefined **)CONCAT71(local_1e8._1_7_,bVar6);
  local_1e0 = 0;
  sStack_1d8.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "col.get_content(veccont.size()) == veccont";
  local_1c8._M_parent = (_Base_ptr)0x1ebeca;
  local_238._M_impl.super__Rb_tree_header._M_header._M_color =
       local_238._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
  local_238._M_impl._0_4_ = 0x22f378;
  local_238._M_impl._4_4_ = 0;
  local_238._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x237128;
  local_238._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
  local_238._M_impl.super__Rb_tree_header._M_header._M_left = &local_1c8;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  boost::test_tools::tt_detail::report_assertion(&local_1e8,&local_238,&local_a0,0x11e,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_1d8);
  if ((_Base_ptr)local_208._0_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_208._0_8_,(long)local_208._M_left - local_208._0_8_);
  }
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x120);
  local_208._M_parent = (_Base_ptr)((ulong)local_208._M_parent & 0xffffffffffffff00);
  local_208._0_8_ = &PTR__lazy_ostream_0022f430;
  local_208._M_left = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_208._M_right = (_Base_ptr)0x1eb2c2;
  local_138 = (_Base_ptr)
              (((long)(col->column_).
                      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(col->column_).
                      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) -
              (col->erasedValues_)._M_h._M_element_count);
  local_128 = &local_138;
  local_140 = local_1c8._M_right[1]._M_parent;
  local_1c8._M_color._0_1_ = local_138 == local_140;
  local_130 = &local_140;
  local_1c8._M_parent = (_Base_ptr)0x0;
  local_1c8._M_left = (_Base_ptr)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_238._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_128;
  local_238._M_impl.super__Rb_tree_header._M_header._M_color =
       local_238._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
  local_238._M_impl._0_4_ = 0x22f3f0;
  local_238._M_impl._4_4_ = 0;
  local_238._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x237128;
  local_238._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
  local_1d0 = &local_130;
  local_1e0 = local_1e0 & 0xffffffffffffff00;
  local_1e8 = &PTR__lazy_ostream_0022f3f0;
  sStack_1d8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,&local_208,&local_40,0x120,1,2,2,"col.size()",&local_238,"setcont.size()",
             &local_1e8);
  boost::detail::shared_count::~shared_count((shared_count *)&local_1c8._M_left);
  if ((veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_c8 = "";
    local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x124);
    local_1e8 = (undefined **)
                CONCAT71(local_1e8._1_7_,
                         (long)(col->column_).
                               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(col->column_).
                               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3 ==
                         (col->erasedValues_)._M_h._M_element_count);
    local_1e0 = 0;
    sStack_1d8.pi_ = (sp_counted_base *)0x0;
    local_208._0_8_ = "col.is_empty()";
    local_208._M_parent = (_Base_ptr)0x1ebef4;
    local_238._M_impl.super__Rb_tree_header._M_header._M_color =
         local_238._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
    local_238._M_impl._0_4_ = 0x22f378;
    local_238._M_impl._4_4_ = 0;
    local_238._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x237128;
    local_238._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
    local_f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_e8 = "";
    local_238._M_impl.super__Rb_tree_header._M_header._M_left = &local_208;
    boost::test_tools::tt_detail::report_assertion();
  }
  else {
    local_100 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_f8 = "";
    local_110 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
    local_108 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x126);
    local_1e8 = (undefined **)
                CONCAT71(local_1e8._1_7_,
                         (long)(col->column_).
                               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(col->column_).
                               super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 3 !=
                         (col->erasedValues_)._M_h._M_element_count);
    local_1e0 = 0;
    sStack_1d8.pi_ = (sp_counted_base *)0x0;
    local_208._0_8_ = "!col.is_empty()";
    local_208._M_parent = (_Base_ptr)0x1ebef4;
    local_238._M_impl.super__Rb_tree_header._M_header._M_color =
         local_238._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
    local_238._M_impl._0_4_ = 0x22f378;
    local_238._M_impl._4_4_ = 0;
    local_238._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x237128;
    local_238._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
    local_120 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_118 = (_Base_ptr)0x1ebe6e;
    local_238._M_impl.super__Rb_tree_header._M_header._M_left = &local_208;
    boost::test_tools::tt_detail::report_assertion();
  }
  boost::detail::shared_count::~shared_count(&sStack_1d8);
  puVar8 = (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar8) {
    uVar11 = 0;
    do {
      uVar15 = (uint)uVar11;
      if (puVar8[uVar11] == 0) {
        local_150 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_148 = "";
        local_160 = &boost::unit_test::basic_cstring<char_const>::null;
        local_158 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_150,0x12a,
                   &local_160);
        uVar10 = (col->erasedValues_)._M_h._M_bucket_count;
        uVar11 = uVar11 % uVar10;
        p_Var14 = (col->erasedValues_)._M_h._M_buckets[uVar11];
        p_Var9 = (__node_base_ptr)0x0;
        if ((p_Var14 != (__node_base_ptr)0x0) &&
           (p_Var4 = p_Var14->_M_nxt, p_Var9 = p_Var14,
           *(uint *)&p_Var14->_M_nxt[1]._M_nxt != uVar15)) {
          while (p_Var14 = p_Var4, p_Var4 = p_Var14->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
            p_Var9 = (__node_base_ptr)0x0;
            if (((ulong)*(uint *)&p_Var4[1]._M_nxt % uVar10 != uVar11) ||
               (p_Var9 = p_Var14, *(uint *)&p_Var4[1]._M_nxt == uVar15)) goto LAB_001352e4;
          }
          p_Var9 = (__node_base_ptr)0x0;
        }
LAB_001352e4:
        if ((p_Var9 == (__node_base_ptr)0x0) ||
           (bVar6 = true, p_Var9->_M_nxt == (_Hash_node_base *)0x0)) {
          local_238._M_impl._0_4_ = 0xffffffff;
          local_238._M_impl._4_4_ = 0;
          local_238._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_238._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          local_238._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
          local_238._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
          local_238._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)
               CONCAT44(local_238._M_impl.super__Rb_tree_header._M_header._M_left._4_4_,uVar15);
          local_208._0_8_ = &local_238;
          bVar6 = std::
                  binary_search<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>*const*,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>*>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>*,Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>::is_non_zero(unsigned_int)const::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>const*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>const*)_1_>
                            ((col->column_).
                             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (col->column_).
                             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish,&local_208);
          lVar5 = CONCAT44(local_238._M_impl.super__Rb_tree_header._M_header._4_4_,
                           local_238._M_impl.super__Rb_tree_header._M_header._M_color);
          if (lVar5 != 0) {
            *(long *)CONCAT44(local_238._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,
                              local_238._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_) =
                 lVar5;
            *(long **)(lVar5 + 8) =
                 (long *)CONCAT44(local_238._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,
                                  local_238._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_)
            ;
            local_238._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_238._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          }
          bVar6 = !bVar6;
        }
        local_1e8 = (undefined **)CONCAT71(local_1e8._1_7_,bVar6);
        local_1e0 = 0;
        sStack_1d8.pi_ = (sp_counted_base *)0x0;
        local_208._0_8_ = "!col.is_non_zero(i)";
        local_208._M_parent = (_Base_ptr)0x1ebf08;
        local_238._M_impl.super__Rb_tree_header._M_header._M_color =
             local_238._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
        local_238._M_impl._0_4_ = 0x22f378;
        local_238._M_impl._4_4_ = 0;
        local_238._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x237128;
        local_238._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
        local_170 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_168 = "";
        local_238._M_impl.super__Rb_tree_header._M_header._M_left = &local_208;
        boost::test_tools::tt_detail::report_assertion(&local_1e8,&local_238,&local_170,0x12a,1,0,0)
        ;
      }
      else {
        local_180 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_178 = "";
        local_190 = &boost::unit_test::basic_cstring<char_const>::null;
        local_188 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,300,&local_190)
        ;
        uVar10 = (col->erasedValues_)._M_h._M_bucket_count;
        uVar11 = uVar11 % uVar10;
        p_Var14 = (col->erasedValues_)._M_h._M_buckets[uVar11];
        p_Var9 = (__node_base_ptr)0x0;
        if ((p_Var14 != (__node_base_ptr)0x0) &&
           (p_Var9 = p_Var14, p_Var13 = p_Var14->_M_nxt,
           *(uint *)&p_Var14->_M_nxt[1]._M_nxt != uVar15)) {
          while (p_Var4 = p_Var13->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
            p_Var9 = (__node_base_ptr)0x0;
            if (((ulong)*(uint *)&p_Var4[1]._M_nxt % uVar10 != uVar11) ||
               (p_Var9 = p_Var13, p_Var13 = p_Var4, *(uint *)&p_Var4[1]._M_nxt == uVar15))
            goto LAB_001351ce;
          }
          p_Var9 = (__node_base_ptr)0x0;
        }
LAB_001351ce:
        if ((p_Var9 == (__node_base_ptr)0x0) || (p_Var9->_M_nxt == (_Hash_node_base *)0x0)) {
          local_238._M_impl._0_4_ = 0xffffffff;
          local_238._M_impl._4_4_ = 0;
          local_238._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_238._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          local_238._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0;
          local_238._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
          local_238._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)
               CONCAT44(local_238._M_impl.super__Rb_tree_header._M_header._M_left._4_4_,uVar15);
          local_208._0_8_ = &local_238;
          bVar6 = std::
                  binary_search<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>*const*,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>*>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>*,Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>::is_non_zero(unsigned_int)const::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>const*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,false,true>>>const*)_1_>
                            ((col->column_).
                             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (col->column_).
                             super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_false,_true>_>_>_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish,&local_208);
          lVar5 = CONCAT44(local_238._M_impl.super__Rb_tree_header._M_header._4_4_,
                           local_238._M_impl.super__Rb_tree_header._M_header._M_color);
          if (lVar5 != 0) {
            *(long *)CONCAT44(local_238._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,
                              local_238._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_) =
                 lVar5;
            *(long **)(lVar5 + 8) =
                 (long *)CONCAT44(local_238._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_,
                                  local_238._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_)
            ;
            local_238._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
            local_238._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          }
        }
        else {
          bVar6 = false;
        }
        local_1e8 = (undefined **)CONCAT71(local_1e8._1_7_,bVar6);
        local_1e0 = 0;
        sStack_1d8.pi_ = (sp_counted_base *)0x0;
        local_208._0_8_ = "col.is_non_zero(i)";
        local_208._M_parent = (_Base_ptr)0x1ebf08;
        local_238._M_impl.super__Rb_tree_header._M_header._M_color =
             local_238._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00;
        local_238._M_impl._0_4_ = 0x22f378;
        local_238._M_impl._4_4_ = 0;
        local_238._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ = 0x237128;
        local_238._M_impl.super__Rb_tree_header._M_header._M_parent._4_4_ = 0;
        local_1a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_198 = "";
        local_238._M_impl.super__Rb_tree_header._M_header._M_left = &local_208;
        boost::test_tools::tt_detail::report_assertion(&local_1e8,&local_238,&local_1a0,300,1,0,0);
      }
      boost::detail::shared_count::~shared_count(&sStack_1d8);
      uVar11 = (ulong)(uVar15 + 1);
      puVar8 = (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)(veccont->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 2))
    ;
  }
  return;
}

Assistant:

void column_test_common_content_access(Column& col,
                                       const std::set<entry_type>& setcont,
                                       const std::vector<typename Column::Field_element>& veccont) {
  BOOST_CHECK(get_column_content_via_iterators(col) == setcont);
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(col.size(), setcont.size());
  }

  if (veccont.empty())
    BOOST_CHECK(col.is_empty());
  else
    BOOST_CHECK(!col.is_empty());

  for (unsigned int i = 0; i < veccont.size(); ++i) {
    if (veccont[i] == 0u)
      BOOST_CHECK(!col.is_non_zero(i));
    else
      BOOST_CHECK(col.is_non_zero(i));
  }
}